

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O3

CBS_ASN1_TAG parse_tag(CBS *cbs)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int line;
  uint8_t c;
  uint64_t num;
  CBS copy;
  byte local_21;
  ulong local_20;
  CBS local_18;
  
  local_18.data = cbs->data;
  local_18.len = cbs->len;
  iVar1 = CBS_get_u64_decimal(&local_18,&local_20);
  if ((iVar1 == 0) || (0x1fffffff < local_20)) {
    iVar1 = 0x91;
    line = 0x5b;
    goto LAB_0050e280;
  }
  iVar1 = CBS_get_u8(&local_18,&local_21);
  if (iVar1 == 0) {
    uVar2 = 0x80000000;
    goto LAB_0050e1ec;
  }
  if (local_21 < 0x50) {
    if (local_21 == 0x41) {
      uVar2 = 0x40000000;
    }
    else {
      if (local_21 != 0x43) {
LAB_0050e203:
        iVar1 = 0x90;
        line = 0x71;
        goto LAB_0050e280;
      }
      uVar2 = 0x80000000;
    }
LAB_0050e22c:
    bVar3 = 0;
  }
  else {
    if (local_21 == 0x50) {
      uVar2 = 0xc0000000;
      goto LAB_0050e22c;
    }
    if (local_21 != 0x55) goto LAB_0050e203;
    uVar2 = 0;
    bVar3 = 1;
  }
  if (local_18.len == 0) {
    if (!(bool)(bVar3 & local_20 == 0)) {
LAB_0050e1ec:
      return (uint)local_20 | uVar2;
    }
    iVar1 = 0x91;
    line = 0x7e;
  }
  else {
    iVar1 = 0x90;
    line = 0x76;
  }
LAB_0050e280:
  ERR_put_error(0xc,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                ,line);
  return 0;
}

Assistant:

static CBS_ASN1_TAG parse_tag(const CBS *cbs) {
  CBS copy = *cbs;
  uint64_t num;
  if (!CBS_get_u64_decimal(&copy, &num) || num > CBS_ASN1_TAG_NUMBER_MASK) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }

  CBS_ASN1_TAG tag_class = CBS_ASN1_CONTEXT_SPECIFIC;
  // The tag may be suffixed by a class.
  uint8_t c;
  if (CBS_get_u8(&copy, &c)) {
    switch (c) {
      case 'U':
        tag_class = CBS_ASN1_UNIVERSAL;
        break;
      case 'A':
        tag_class = CBS_ASN1_APPLICATION;
        break;
      case 'P':
        tag_class = CBS_ASN1_PRIVATE;
        break;
      case 'C':
        tag_class = CBS_ASN1_CONTEXT_SPECIFIC;
        break;
      default: {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_MODIFIER);
        return 0;
      }
    }
    if (CBS_len(&copy) != 0) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_MODIFIER);
      return 0;
    }
  }

  // Tag [UNIVERSAL 0] is reserved for indefinite-length end-of-contents. We
  // also use zero in this file to indicator no explicit tagging.
  if (tag_class == CBS_ASN1_UNIVERSAL && num == 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }

  return tag_class | (CBS_ASN1_TAG)num;
}